

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O3

void __thiscall QAbstractSocketPrivate::~QAbstractSocketPrivate(QAbstractSocketPrivate *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR__QAbstractSocketPrivate_002cc470;
  (this->super_QAbstractSocketEngineReceiver)._vptr_QAbstractSocketEngineReceiver =
       (_func_int **)&PTR__QAbstractSocketPrivate_002cc510;
  pDVar1 = (this->protocolTag).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->protocolTag).d.d)->super_QArrayData,2,0x10);
    }
  }
  QNetworkProxy::~QNetworkProxy(&this->proxyInUse);
  QNetworkProxy::~QNetworkProxy(&this->proxy);
  pDVar1 = (this->peerName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->peerName).d.d)->super_QArrayData,2,0x10);
    }
  }
  QHostAddress::~QHostAddress(&this->peerAddress);
  QHostAddress::~QHostAddress(&this->localAddress);
  QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&(this->addresses).d);
  QHostAddress::~QHostAddress(&this->host);
  pDVar1 = (this->hostName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->hostName).d.d)->super_QArrayData,2,0x10);
    }
  }
  QIODevicePrivate::~QIODevicePrivate(&this->super_QIODevicePrivate);
  return;
}

Assistant:

QAbstractSocketPrivate::~QAbstractSocketPrivate()
{
}